

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O3

void __thiscall
wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::TopologicalOrdersImpl
          (TopologicalOrdersImpl<std::less<unsigned_int>_> *this,Graph_conflict *graph)

{
  vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
  *this_00;
  pointer puVar1;
  pointer pvVar2;
  pointer puVar3;
  iterator iVar4;
  const_iterator __begin2;
  pointer pvVar5;
  fd_set *pfVar6;
  Index extraout_var;
  fd_set *__writefds;
  fd_set *extraout_RDX;
  fd_set *extraout_RDX_00;
  fd_set *pfVar7;
  fd_set *extraout_RDX_01;
  fd_set *extraout_RDX_02;
  long lVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  fd_set *__exceptfds;
  timeval *in_R9;
  fd_set *pfVar9;
  pointer pSVar10;
  Selector local_40;
  
  this->graph = graph;
  this_01 = &this->indegrees;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this_01,((long)(graph->
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(graph->
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)&local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->buf,
             ((long)(graph->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(graph->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)&local_40);
  (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->selectors).
  super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->selectors).
  super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->selectors).
  super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar5 = (graph->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (graph->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)pvVar2 - (long)pvVar5;
  if (lVar8 != 0) {
    this_00 = &this->selectors;
    puVar3 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      __exceptfds = (fd_set *)
                    (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
      for (pfVar7 = (fd_set *)
                    (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start; pfVar7 != __exceptfds;
          pfVar7 = (fd_set *)((long)pfVar7->fds_bits + 4)) {
        in_R9 = (timeval *)(ulong)(uint)pfVar7->fds_bits[0];
        puVar1 = puVar3 + (long)in_R9;
        *puVar1 = *puVar1 + 1;
      }
      pvVar5 = pvVar5 + 1;
    } while (pvVar5 != pvVar2);
    std::
    vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
    ::reserve(this_00,(lVar8 >> 3) * -0x5555555555555555);
    local_40.start = 0;
    local_40.count = 0;
    local_40.index = 0;
    iVar4._M_current =
         (this->selectors).
         super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->selectors).
        super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>>
      ::_M_realloc_insert<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>
                ((vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>>
                  *)this_00,iVar4,&local_40);
      pSVar10 = (this->selectors).
                super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pfVar7 = extraout_RDX_00;
    }
    else {
      (iVar4._M_current)->index = 0;
      (iVar4._M_current)->start = 0;
      (iVar4._M_current)->count = 0;
      pSVar10 = (this->selectors).
                super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->selectors).
      super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar10;
      pfVar7 = extraout_RDX;
    }
    pfVar6 = (fd_set *)
             (graph->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    __writefds = (fd_set *)
                 (graph->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
    if (__writefds != pfVar6) {
      pfVar9 = (fd_set *)0x0;
      do {
        if ((this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[(long)pfVar9] == 0) {
          pushChoice(this,(Index)pfVar9);
          pSVar10[-1].count = pSVar10[-1].count + 1;
          pfVar6 = (fd_set *)
                   (graph->
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          __writefds = (fd_set *)
                       (graph->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
        }
        pfVar9 = (fd_set *)(ulong)((Index)pfVar9 + 1);
        pfVar7 = (fd_set *)(((long)__writefds - (long)pfVar6 >> 3) * -0x5555555555555555);
      } while (pfVar9 <= pfVar7 && (long)pfVar7 - (long)pfVar9 != 0);
      pSVar10 = (this->selectors).
                super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((fd_set *)
          (((long)pSVar10 -
            (long)(this->selectors).
                  super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) < pfVar7) {
        do {
          local_40.start =
               Selector::select(pSVar10 + -1,(int)this,pfVar7,__writefds,__exceptfds,in_R9);
          local_40.count = extraout_var;
          local_40.index = (Index)extraout_RDX_01;
          iVar4._M_current =
               (this->selectors).
               super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->selectors).
              super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>>
            ::_M_realloc_insert<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>
                      ((vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>>
                        *)this_00,iVar4,&local_40);
            pSVar10 = (this->selectors).
                      super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pfVar7 = extraout_RDX_02;
          }
          else {
            (iVar4._M_current)->index = local_40.index;
            (iVar4._M_current)->start = local_40.start;
            (iVar4._M_current)->count = extraout_var;
            pSVar10 = (this->selectors).
                      super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->selectors).
            super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
            ._M_impl.super__Vector_impl_data._M_finish = pSVar10;
            pfVar7 = extraout_RDX_01;
          }
          __writefds = (fd_set *)
                       (((long)(graph->
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(graph->
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 3) *
                       -0x5555555555555555);
        } while ((fd_set *)
                 (((long)pSVar10 -
                   (long)(this_00->
                         super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
                 __writefds);
      }
    }
    Selector::select(pSVar10 + -1,(int)this,pfVar7,__writefds,__exceptfds,in_R9);
  }
  return;
}

Assistant:

TopologicalOrdersImpl(const Graph& graph, Cmp cmp)
    : graph(graph), indegrees(graph.size()), buf(graph.size()), cmp(cmp) {
    if (graph.size() == 0) {
      return;
    }
    // Find the in-degree of each vertex.
    for (const auto& vertex : graph) {
      for (auto child : vertex) {
        ++indegrees[child];
      }
    }
    // Set up the first selector with its possible selections.
    selectors.reserve(graph.size());
    selectors.push_back({0, 0, 0});
    auto& first = selectors.back();
    for (Index i = 0; i < graph.size(); ++i) {
      if (indegrees[i] == 0) {
        if constexpr (useMinHeap) {
          pushChoice(i);
        } else {
          buf[first.count] = i;
        }
        ++first.count;
      }
    }
    // Initialize the full stack of selectors.
    while (selectors.size() < graph.size()) {
      selectors.push_back(selectors.back().select(*this));
    }
    selectors.back().select(*this);
  }